

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_color_mode_copy(LodePNGColorMode *dest,LodePNGColorMode *source)

{
  uchar **ppuVar1;
  uint uVar2;
  LodePNGColorType LVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  long lVar7;
  
  ppuVar1 = &dest->palette;
  if (dest->palette != (uchar *)0x0) {
    free(dest->palette);
  }
  *ppuVar1 = (uchar *)0x0;
  dest->palettesize = 0;
  uVar5 = source->key_b;
  dest->key_g = source->key_g;
  dest->key_b = uVar5;
  LVar3 = source->colortype;
  uVar4 = source->bitdepth;
  puVar6 = source->palette;
  uVar5 = source->key_defined;
  uVar2 = source->key_r;
  dest->palettesize = source->palettesize;
  dest->key_defined = uVar5;
  dest->key_r = uVar2;
  dest->colortype = LVar3;
  dest->bitdepth = uVar4;
  dest->palette = puVar6;
  uVar5 = 0;
  if (source->palette != (uchar *)0x0) {
    puVar6 = (uchar *)malloc(0x400);
    *ppuVar1 = puVar6;
    if (((puVar6 != (uchar *)0x0) || (uVar5 = 0x53, source->palettesize == 0)) &&
       (uVar5 = 0, (source->palettesize & 0x3fffffffffffffff) != 0)) {
      uVar5 = 0;
      lVar7 = 0;
      do {
        (*ppuVar1)[lVar7] = source->palette[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar7 != source->palettesize << 2);
    }
  }
  return uVar5;
}

Assistant:

unsigned lodepng_color_mode_copy(LodePNGColorMode* dest, const LodePNGColorMode* source)
{
	size_t i;
	lodepng_color_mode_cleanup(dest);
	*dest = *source;
	if (source->palette)
	{
		dest->palette = (unsigned char*)lodepng_malloc(1024);
		if (!dest->palette && source->palettesize) return 83; /*alloc fail*/
		for (i = 0; i != source->palettesize * 4; ++i) dest->palette[i] = source->palette[i];
	}
	return 0;
}